

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

void listen_cb(uv_stream_t *handle,int status)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  undefined8 *extraout_RDX;
  int iVar5;
  uv_loop_t *puVar6;
  uv_buf_t uStack_418;
  undefined1 auStack_408 [144];
  code *pcStack_378;
  uv_loop_t uStack_370;
  uv_loop_t *puStack_20;
  
  if ((echo_ctx *)handle == &ctx2) {
    if (status != 0) goto LAB_0015f61b;
    iVar1 = uv_accept((uv_stream_t *)&ctx2,(uv_stream_t *)&ctx2.channel);
    if (iVar1 == 0) {
      send_recv_start();
      return;
    }
  }
  else {
    listen_cb_cold_1();
LAB_0015f61b:
    listen_cb_cold_2();
  }
  listen_cb_cold_3();
  iVar1 = uv_is_readable((uv_stream_t *)&ctx2.channel);
  if (iVar1 == 1) {
    iVar1 = uv_is_writable((uv_stream_t *)&ctx2.channel);
    if (iVar1 != 1) goto LAB_0015f67d;
    iVar1 = uv_is_closing((uv_handle_t *)&ctx2.channel);
    if (iVar1 != 0) goto LAB_0015f682;
    iVar1 = uv_read_start((uv_stream_t *)&ctx2.channel,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    send_recv_start_cold_1();
LAB_0015f67d:
    send_recv_start_cold_2();
LAB_0015f682:
    send_recv_start_cold_3();
  }
  send_recv_start_cold_4();
  puStack_20 = (uv_loop_t *)0x15f692;
  puVar3 = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x15f69c;
  run_ipc_send_recv_helper(puVar3,0);
  puStack_20 = (uv_loop_t *)0x15f6a1;
  puVar3 = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x15f6b5;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_20 = (uv_loop_t *)0x15f6bf;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_20 = (uv_loop_t *)0x15f6c4;
  puVar4 = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x15f6cc;
  iVar1 = uv_loop_close(puVar4);
  if (iVar1 == 0) {
    return;
  }
  puStack_20 = (uv_loop_t *)ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_1();
  iVar1 = (int)&uStack_370;
  pcStack_378 = (code *)0x15f6e9;
  puStack_20 = puVar3;
  iVar2 = uv_loop_init(&uStack_370);
  if (iVar2 == 0) {
    pcStack_378 = (code *)0x15f6fd;
    run_ipc_send_recv_helper(&uStack_370,1);
    pcStack_378 = (code *)0x15f705;
    iVar1 = (int)&uStack_370;
    iVar2 = uv_loop_close(&uStack_370);
    puVar3 = &uStack_370;
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_378 = (code *)0x15f717;
    ipc_send_recv_helper_threadproc_cold_1();
  }
  pcStack_378 = run_test;
  ipc_send_recv_helper_threadproc_cold_2();
  puVar4 = (uv_loop_t *)auStack_408;
  puVar6 = (uv_loop_t *)auStack_408;
  pcStack_378 = (code *)puVar3;
  if (iVar1 == 0) {
    uStack_418.len = 0x15f7ac;
    spawn_helper(&ctx.channel,(uv_process_t *)(auStack_408 + 8),"ipc_send_recv_helper");
    uStack_418.len = 0x15f7ba;
    connect_cb(&ctx.connect_req,0);
LAB_0015f7ba:
    uStack_418.len = 0x15f7bf;
    puVar4 = uv_default_loop();
    iVar5 = 0;
    uStack_418.len = 0x15f7c9;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) {
      uStack_418.len = 0x15f7f4;
      run_test_cold_3();
LAB_0015f7f4:
      uStack_418.len = 0x15f7f9;
      run_test_cold_4();
LAB_0015f7f9:
      uStack_418.len = 0x15f7fe;
      run_test_cold_1();
      goto LAB_0015f7fe;
    }
    if (recv_cb_count != 2) goto LAB_0015f7f4;
    if (iVar1 == 0) {
      return;
    }
    uStack_418.len = 0x15f7e2;
    iVar1 = uv_thread_join((uv_thread_t *)auStack_408);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    iVar5 = 0x15f6d9;
    uStack_418.len = 0x15f73e;
    iVar2 = uv_thread_create((uv_thread_t *)auStack_408,ipc_send_recv_helper_threadproc,(void *)0x2a
                            );
    if (iVar2 != 0) goto LAB_0015f7f9;
    uStack_418.len = 0x15f750;
    uv_sleep(1000);
    uStack_418.len = 0x15f755;
    puVar4 = uv_default_loop();
    iVar5 = 0x2fef60;
    uStack_418.len = 0x15f769;
    iVar2 = uv_pipe_init(puVar4,&ctx.channel,1);
    if (iVar2 == 0) {
      uStack_418.len = 0x15f792;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0015f7ba;
    }
LAB_0015f7fe:
    puVar6 = puVar4;
    uStack_418.len = 0x15f803;
    run_test_cold_2();
  }
  uStack_418.len = (size_t)connect_cb;
  run_test_cold_5();
  if (puVar6 == (uv_loop_t *)&ctx.connect_req) {
    if (iVar5 != 0) goto LAB_0015f8d8;
    uStack_418 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_418,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    if (iVar1 != 0) goto LAB_0015f8dd;
    uStack_418 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_418,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015f8e7;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0015f8d8:
    connect_cb_cold_2();
LAB_0015f8dd:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_0015f8e7:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return;
}

Assistant:

static void listen_cb(uv_stream_t* handle, int status) {
  int r;
  ASSERT(handle == (uv_stream_t*)&ctx2.listen);
  ASSERT(status == 0);

  r = uv_accept((uv_stream_t*)&ctx2.listen, (uv_stream_t*)&ctx2.channel);
  ASSERT(r == 0);

  send_recv_start();
}